

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_uescape_key(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  char *pcVar9;
  undefined8 extraout_RAX;
  long lVar10;
  int *__haystack;
  undefined1 *__buf;
  undefined8 extraout_RAX_00;
  long *plVar11;
  undefined8 extraout_RAX_01;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  ulong unaff_R12;
  undefined **ppuVar18;
  undefined1 *unaff_R13;
  undefined **ppuVar19;
  void *unaff_R14;
  int *piVar20;
  void *unaff_R15;
  undefined **ppuVar21;
  int *piVar22;
  double dVar23;
  int extraout_XMM0_Db;
  bson_t b;
  bson_error_t error;
  code **ppcVar24;
  undefined4 uStack_315c;
  undefined8 uStack_3158;
  undefined2 uStack_3150;
  int iStack_3148;
  int iStack_3144;
  char acStack_3140 [504];
  code *pcStack_2f48;
  undefined1 auStack_2f38 [512];
  char *pcStack_2d38;
  code *pcStack_2d30;
  int iStack_2d20;
  int iStack_2d1c;
  char acStack_2d18 [504];
  long *plStack_2b20;
  char *pcStack_2b18;
  char *pcStack_2b10;
  undefined **ppuStack_2b08;
  long lStack_2a90;
  long lStack_2a88;
  undefined1 auStack_2a80 [128];
  undefined1 auStack_2a00 [232];
  undefined1 auStack_2918 [608];
  long *plStack_26b8;
  code *pcStack_26b0;
  undefined1 auStack_26a8 [8];
  char acStack_26a0 [16];
  char *pcStack_2690;
  code *pcStack_2688;
  uint uStack_2604;
  undefined8 uStack_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 uStack_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 auStack_2538 [648];
  int *piStack_22b0;
  char *pcStack_22a8;
  undefined **ppuStack_22a0;
  undefined1 *puStack_2298;
  undefined **ppuStack_2290;
  code *pcStack_2288;
  undefined1 auStack_2280 [240];
  undefined1 auStack_2190 [648];
  code *apcStack_1f08 [16];
  undefined *puStack_1e88;
  undefined1 auStack_1e80 [200];
  undefined8 uStack_1db8;
  int aiStack_1db0 [160];
  int *piStack_1b30;
  double *pdStack_1b28;
  undefined **ppuStack_1b20;
  int *piStack_1b18;
  int *piStack_1b10;
  code *apcStack_1b08 [16];
  double dStack_1a88;
  int aiStack_1a80 [50];
  int iStack_19b8;
  int iStack_19b4;
  int aiStack_19b0 [160];
  undefined8 uStack_1730;
  undefined1 *puStack_1728;
  char *pcStack_1720;
  char *pcStack_1718;
  undefined **ppuStack_1710;
  code *pcStack_1708;
  int iStack_1700;
  int iStack_16fc;
  char acStack_16f8 [504];
  undefined1 auStack_1500 [336];
  char *pcStack_13b0;
  ulong uStack_13a8;
  undefined1 *puStack_13a0;
  void *pvStack_1398;
  void *pvStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [232];
  undefined1 auStack_1218 [648];
  char *pcStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  char acStack_f00 [224];
  int iStack_e20;
  int iStack_e1c;
  char acStack_e18 [640];
  char *pcStack_b98;
  void *pvStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [128];
  char acStack_b00 [232];
  undefined1 auStack_a18 [648];
  char *pcStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [232];
  int iStack_698;
  int iStack_694;
  char acStack_690 [640];
  char *pcStack_410;
  code *apcStack_408 [16];
  uint local_384;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  apcStack_408[0] = (code *)0x132cd6;
  uVar5 = bson_bcon_magic();
  apcStack_408[0] = (code *)0x132cf5;
  pcVar6 = (char *)bcon_new(0,anon_var_dwarf_48e4 + 0xc,uVar5,0,"euro",0);
  apcStack_408[0] = (code *)0x132d1b;
  cVar1 = bson_init_from_json(local_380,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,local_2b8);
  if (cVar1 == '\0') {
    apcStack_408[0] = (code *)0x132e94;
    test_bson_json_uescape_key_cold_1();
  }
  else {
    apcStack_408[0] = (code *)0x132d33;
    unaff_R15 = (void *)bson_get_data(local_380);
    apcStack_408[0] = (code *)0x132d3e;
    unaff_R14 = (void *)bson_get_data(pcVar6);
    if (*(uint *)(pcVar6 + 4) == local_37c) {
      apcStack_408[0] = (code *)0x132d53;
      pvVar7 = (void *)bson_get_data(pcVar6);
      apcStack_408[0] = (code *)0x132d63;
      pvVar8 = (void *)bson_get_data(local_380);
      apcStack_408[0] = (code *)0x132d71;
      iVar2 = bcmp(pvVar7,pvVar8,(ulong)*(uint *)(pcVar6 + 4));
      if (iVar2 == 0) {
        apcStack_408[0] = (code *)0x132d82;
        bson_destroy(local_380);
        apcStack_408[0] = (code *)0x132d8a;
        bson_destroy(pcVar6);
        return;
      }
    }
    unaff_R13 = local_380;
    apcStack_408[0] = (code *)0x132dab;
    unaff_R12 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_408[0] = (code *)0x132db8;
    uVar5 = bson_as_canonical_extended_json(pcVar6);
    uVar3 = *(uint *)(pcVar6 + 4);
    if (local_37c != 0) {
      uVar15 = 0;
      do {
        if (uVar3 == (uint)uVar15) break;
        if (*(char *)((long)unaff_R15 + uVar15) != *(char *)((long)unaff_R14 + uVar15))
        goto LAB_00132e88;
        uVar15 = uVar15 + 1;
      } while (local_37c != (uint)uVar15);
    }
    uVar4 = local_37c;
    if (local_37c < uVar3) {
      uVar4 = uVar3;
    }
    uVar15 = (ulong)(uVar4 - 1);
    while( true ) {
      apcStack_408[0] = (code *)0x132e04;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar15,unaff_R12,uVar5);
      apcStack_408[0] = (code *)0x132e1c;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      unaff_R12 = (ulong)uVar3;
      apcStack_408[0] = (code *)0x132e37;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      local_384 = uVar3;
      if (uVar3 == 0xffffffff) break;
      unaff_R13 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_00132e99;
      unaff_R12 = (ulong)local_37c;
      apcStack_408[0] = (code *)0x132e61;
      uVar15 = write(uVar3,unaff_R15,unaff_R12);
      if (uVar15 != unaff_R12) goto LAB_00132e9e;
      pcVar6 = (char *)(ulong)*(uint *)(pcVar6 + 4);
      apcStack_408[0] = (code *)0x132e77;
      pcVar9 = (char *)write(uVar4,unaff_R14,(size_t)pcVar6);
      if (pcVar9 != pcVar6) goto LAB_00132ea3;
      uVar15 = (ulong)uVar4;
      apcStack_408[0] = (code *)0x132e88;
      test_bson_json_uescape_key_cold_4();
      uVar5 = extraout_RAX;
LAB_00132e88:
      uVar15 = uVar15 & 0xffffffff;
    }
  }
  apcStack_408[0] = (code *)0x132e99;
  test_bson_json_uescape_key_cold_6();
LAB_00132e99:
  apcStack_408[0] = (code *)0x132e9e;
  test_bson_json_uescape_key_cold_5();
LAB_00132e9e:
  apcStack_408[0] = (code *)0x132ea3;
  test_bson_json_uescape_key_cold_2();
LAB_00132ea3:
  apcStack_408[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_788 = (code *)0x132ed6;
  pcStack_410 = pcVar6;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_698);
  if (cVar1 == '\0') {
    if (iStack_698 != 1) goto LAB_00132f22;
    if (iStack_694 != 1) goto LAB_00132f27;
    pcVar6 = acStack_690;
    pcStack_788 = (code *)0x132f09;
    pcVar9 = strstr(pcVar6,"UESCAPE_TOOSHORT");
    if (pcVar9 != (char *)0x0) {
      pcStack_788 = (code *)0x132f16;
      bson_destroy(auStack_780);
      return;
    }
  }
  else {
    pcStack_788 = (code *)0x132f22;
    test_bson_json_uescape_bad_cold_4();
LAB_00132f22:
    pcStack_788 = (code *)0x132f27;
    test_bson_json_uescape_bad_cold_1();
LAB_00132f27:
    pcStack_788 = (code *)0x132f2c;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_788 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_b88 = (code *)0x132f67;
  pcStack_790 = pcVar6;
  pcStack_788 = (code *)apcStack_408;
  cVar1 = bson_init_from_json(acStack_b00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_a18);
  if (cVar1 == '\0') {
LAB_00133159:
    pcStack_b88 = (code *)0x133166;
    test_bson_json_int32_cold_1();
LAB_00133166:
    pcStack_b88 = (code *)0x13316e;
    test_bson_json_int32_cold_4();
LAB_0013316e:
    pcStack_b88 = (code *)0x13317b;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_b88 = (code *)0x132f86;
    cVar1 = bson_iter_init_find(auStack_b80,acStack_b00,"x");
    if (cVar1 == '\0') {
      pcStack_b88 = (code *)0x133136;
      test_bson_json_int32_cold_2();
LAB_00133136:
      pcStack_b88 = (code *)0x13313b;
      test_bson_json_int32_cold_3();
LAB_0013313b:
      pcStack_b88 = (code *)0x133140;
      test_bson_json_int32_cold_6();
LAB_00133140:
      pcStack_b88 = (code *)0x133145;
      test_bson_json_int32_cold_7();
      pcStack_b88 = (code *)0x13314a;
      test_bson_json_int32_cold_10();
      pcStack_b88 = (code *)0x13314f;
      test_bson_json_int32_cold_11();
      pcStack_b88 = (code *)0x133154;
      test_bson_json_int32_cold_14();
      pcStack_b88 = (code *)0x133159;
      test_bson_json_int32_cold_15();
      goto LAB_00133159;
    }
    pcStack_b88 = (code *)0x132f96;
    iVar2 = bson_iter_type(auStack_b80);
    if (iVar2 != 0x10) goto LAB_00133136;
    pcStack_b88 = (code *)0x132fa7;
    iVar2 = bson_iter_int32(auStack_b80);
    if (iVar2 != 0x7fffffff) goto LAB_00133166;
    pcVar6 = acStack_b00;
    pcStack_b88 = (code *)0x132fc2;
    bson_destroy(pcVar6);
    pcStack_b88 = (code *)0x132fe0;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_a18);
    if (cVar1 == '\0') goto LAB_0013316e;
    pcStack_b88 = (code *)0x132fff;
    cVar1 = bson_iter_init_find(auStack_b80,acStack_b00,"x");
    if (cVar1 == '\0') goto LAB_0013313b;
    pcStack_b88 = (code *)0x13300f;
    iVar2 = bson_iter_type(auStack_b80);
    if (iVar2 != 0x10) goto LAB_00133140;
    pcStack_b88 = (code *)0x133020;
    bson_iter_int32(auStack_b80);
  }
  pcStack_b88 = (code *)0x133183;
  test_bson_json_int32_cold_8();
  pcStack_b88 = (code *)0x133190;
  test_bson_json_int32_cold_9();
  pcStack_b88 = (code *)0x133198;
  test_bson_json_int32_cold_12();
  pcStack_b88 = (code *)0x1331a5;
  test_bson_json_int32_cold_13();
  pcStack_b88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_f88 = (code *)0x1331e2;
  pcStack_b98 = pcVar6;
  pvStack_b90 = unaff_R14;
  pcStack_b88 = (code *)&pcStack_788;
  cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_e20);
  if (cVar1 == '\0') {
LAB_0013347b:
    pcStack_f88 = (code *)0x133488;
    test_bson_json_int64_cold_1();
LAB_00133488:
    pcStack_f88 = (code *)0x133490;
    test_bson_json_int64_cold_4();
LAB_00133490:
    pcStack_f88 = (code *)0x13349d;
    test_bson_json_int64_cold_5();
LAB_0013349d:
    pcStack_f88 = (code *)0x1334a5;
    test_bson_json_int64_cold_8();
LAB_001334a5:
    pcStack_f88 = (code *)0x1334aa;
    test_bson_json_int64_cold_9();
LAB_001334aa:
    pcStack_f88 = (code *)0x1334af;
    test_bson_json_int64_cold_10();
LAB_001334af:
    pcStack_f88 = (code *)0x1334b7;
    test_bson_json_int64_cold_23();
LAB_001334b7:
    pcStack_f88 = (code *)0x1334bc;
    test_bson_json_int64_cold_11();
LAB_001334bc:
    pcStack_f88 = (code *)0x1334c1;
    test_bson_json_int64_cold_12();
LAB_001334c1:
    pcStack_f88 = (code *)0x1334c9;
    test_bson_json_int64_cold_21();
LAB_001334c9:
    pcStack_f88 = (code *)0x1334ce;
    test_bson_json_int64_cold_13();
LAB_001334ce:
    pcStack_f88 = (code *)0x1334d3;
    test_bson_json_int64_cold_14();
LAB_001334d3:
    pcStack_f88 = (code *)0x1334db;
    test_bson_json_int64_cold_19();
LAB_001334db:
    pcStack_f88 = (code *)0x1334e0;
    test_bson_json_int64_cold_15();
LAB_001334e0:
    pcStack_f88 = (code *)0x1334e5;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_f88 = (code *)0x133201;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') {
      pcStack_f88 = (code *)0x133458;
      test_bson_json_int64_cold_2();
LAB_00133458:
      pcStack_f88 = (code *)0x13345d;
      test_bson_json_int64_cold_3();
LAB_0013345d:
      pcStack_f88 = (code *)0x133462;
      test_bson_json_int64_cold_6();
LAB_00133462:
      pcStack_f88 = (code *)0x133467;
      test_bson_json_int64_cold_7();
LAB_00133467:
      pcStack_f88 = (code *)0x13346c;
      test_bson_json_int64_cold_24();
LAB_0013346c:
      pcStack_f88 = (code *)0x133471;
      test_bson_json_int64_cold_22();
LAB_00133471:
      pcStack_f88 = (code *)0x133476;
      test_bson_json_int64_cold_20();
LAB_00133476:
      pcStack_f88 = (code *)0x13347b;
      test_bson_json_int64_cold_18();
      goto LAB_0013347b;
    }
    pcStack_f88 = (code *)0x133211;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x12) goto LAB_00133458;
    unaff_R14 = (void *)0x7fffffffffffffff;
    pcStack_f88 = (code *)0x13322c;
    lVar10 = bson_iter_int64(auStack_f80);
    if (lVar10 != 0x7fffffffffffffff) goto LAB_00133488;
    pcVar6 = acStack_f00;
    pcStack_f88 = (code *)0x133245;
    bson_destroy(pcVar6);
    pcStack_f88 = (code *)0x133263;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 == '\0') goto LAB_00133490;
    pcStack_f88 = (code *)0x133282;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') goto LAB_0013345d;
    pcStack_f88 = (code *)0x133292;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x12) goto LAB_00133462;
    pcStack_f88 = (code *)0x1332a3;
    lVar10 = bson_iter_int64(auStack_f80);
    unaff_R14 = (void *)0x8000000000000000;
    if (lVar10 != -0x8000000000000000) goto LAB_0013349d;
    pcVar6 = acStack_f00;
    pcStack_f88 = (code *)0x1332bf;
    bson_destroy(pcVar6);
    pcStack_f88 = (code *)0x1332dd;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00133467;
    if (iStack_e20 != 1) goto LAB_001334a5;
    if (iStack_e1c != 2) goto LAB_001334aa;
    pcVar6 = acStack_e18;
    pcStack_f88 = (code *)0x13331c;
    pcVar9 = strstr(pcVar6,"Number \"9223372036854775808\" is out of range");
    if (pcVar9 == (char *)0x0) goto LAB_001334af;
    pcStack_f88 = (code *)0x133348;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_0013346c;
    if (iStack_e20 != 1) goto LAB_001334b7;
    if (iStack_e1c != 2) goto LAB_001334bc;
    pcStack_f88 = (code *)0x13337f;
    pcVar9 = strstr(pcVar6,"Number \"-9223372036854775809\" is out of range");
    if (pcVar9 == (char *)0x0) goto LAB_001334c1;
    pcStack_f88 = (code *)0x1333ab;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00133471;
    if (iStack_e20 != 1) goto LAB_001334c9;
    if (iStack_e1c != 2) goto LAB_001334ce;
    pcStack_f88 = (code *)0x1333e2;
    pcVar9 = strstr(pcVar6,"Number \"10000000000000000000\" is out of range");
    if (pcVar9 == (char *)0x0) goto LAB_001334d3;
    pcStack_f88 = (code *)0x13340e;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00133476;
    if (iStack_e20 != 1) goto LAB_001334db;
    if (iStack_e1c != 2) goto LAB_001334e0;
    pcStack_f88 = (code *)0x133441;
    pcVar9 = strstr(pcVar6,"Number \"-10000000000000000000\" is out of range");
    if (pcVar9 != (char *)0x0) {
      return;
    }
  }
  pcStack_f88 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1388 = (code *)0x133520;
  pcStack_f90 = pcVar6;
  pcStack_f88 = (code *)&pcStack_b88;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1218);
  if (cVar1 == '\0') {
LAB_001337c5:
    pcStack_1388 = (code *)0x1337d2;
    test_bson_json_double_cold_1();
LAB_001337d2:
    pcStack_1388 = (code *)0x1337da;
    test_bson_json_double_cold_4();
LAB_001337da:
    pcStack_1388 = (code *)0x1337e7;
    test_bson_json_double_cold_5();
LAB_001337e7:
    pcStack_1388 = (code *)0x1337ef;
    test_bson_json_double_cold_8();
LAB_001337ef:
    pcStack_1388 = (code *)0x1337fc;
    test_bson_json_double_cold_9();
LAB_001337fc:
    pcStack_1388 = (code *)0x133804;
    test_bson_json_double_cold_12();
LAB_00133804:
    pcStack_1388 = (code *)0x133811;
    test_bson_json_double_cold_13();
LAB_00133811:
    pcStack_1388 = (code *)0x133819;
    test_bson_json_double_cold_16();
LAB_00133819:
    pcStack_1388 = (code *)0x133826;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1388 = (code *)0x13353f;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x133793;
      test_bson_json_double_cold_2();
LAB_00133793:
      pcStack_1388 = (code *)0x133798;
      test_bson_json_double_cold_3();
LAB_00133798:
      pcStack_1388 = (code *)0x13379d;
      test_bson_json_double_cold_6();
LAB_0013379d:
      pcStack_1388 = (code *)0x1337a2;
      test_bson_json_double_cold_7();
LAB_001337a2:
      pcStack_1388 = (code *)0x1337a7;
      test_bson_json_double_cold_10();
LAB_001337a7:
      pcStack_1388 = (code *)0x1337ac;
      test_bson_json_double_cold_11();
LAB_001337ac:
      pcStack_1388 = (code *)0x1337b1;
      test_bson_json_double_cold_14();
LAB_001337b1:
      pcStack_1388 = (code *)0x1337b6;
      test_bson_json_double_cold_15();
LAB_001337b6:
      pcStack_1388 = (code *)0x1337bb;
      test_bson_json_double_cold_18();
LAB_001337bb:
      pcStack_1388 = (code *)0x1337c0;
      test_bson_json_double_cold_19();
LAB_001337c0:
      pcStack_1388 = (code *)0x1337c5;
      test_bson_json_double_cold_21();
      goto LAB_001337c5;
    }
    pcStack_1388 = (code *)0x13354f;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_00133793;
    pcStack_1388 = (code *)0x133560;
    iVar2 = bson_iter_int32(auStack_1380);
    if (iVar2 != 1) goto LAB_001337d2;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x133579;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x133597;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_001337da;
    pcStack_1388 = (code *)0x1335b6;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_00133798;
    pcStack_1388 = (code *)0x1335c6;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_0013379d;
    pcStack_1388 = (code *)0x1335d7;
    lVar10 = bson_iter_int64(auStack_1380);
    if (lVar10 != 0x100000000) goto LAB_001337e7;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x1335fa;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x133618;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_001337ef;
    pcStack_1388 = (code *)0x133637;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_001337a2;
    pcStack_1388 = (code *)0x133647;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_001337a7;
    pcStack_1388 = (code *)0x133658;
    dVar23 = (double)bson_iter_double(auStack_1380);
    if ((dVar23 != 1.0) || (NAN(dVar23))) goto LAB_001337fc;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x13367c;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x13369a;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_00133804;
    pcStack_1388 = (code *)0x1336b9;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_001337ac;
    pcStack_1388 = (code *)0x1336c9;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_001337b1;
    pcStack_1388 = (code *)0x1336da;
    dVar23 = (double)bson_iter_double(auStack_1380);
    if ((dVar23 != 0.0) || (NAN(dVar23))) goto LAB_00133811;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x1336fe;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x13371c;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_00133819;
    pcStack_1388 = (code *)0x13373b;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_001337b6;
    pcStack_1388 = (code *)0x133747;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_001337bb;
    pcStack_1388 = (code *)0x133754;
    dVar23 = (double)bson_iter_double(auStack_1380);
    if ((dVar23 == 0.0) && (!NAN(dVar23))) {
      pcStack_1388 = (code *)0x133770;
      bson_iter_double(auStack_1380);
      if (extraout_XMM0_Db < 0) {
        pcStack_1388 = (code *)0x133787;
        bson_destroy(acStack_1300);
        return;
      }
      goto LAB_001337c0;
    }
  }
  pcStack_1388 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar9 = "2e400";
  ppuVar21 = &PTR_anon_var_dwarf_1aedf_00163308;
  pcStack_13b0 = pcVar6;
  uStack_13a8 = unaff_R12;
  puStack_13a0 = unaff_R13;
  pvStack_1398 = unaff_R14;
  pvStack_1390 = unaff_R15;
  pcStack_1388 = (code *)&pcStack_f88;
  while( true ) {
    pcStack_1708 = (code *)0x13386c;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar9);
    pcStack_1708 = (code *)0x133889;
    cVar1 = bson_init_from_json(auStack_1500,uVar5,0xffffffffffffffff,&iStack_1700);
    if (cVar1 != '\0') break;
    if (iStack_1700 != 1) goto LAB_00133953;
    if (iStack_16fc != 2) goto LAB_0013394e;
    pcStack_1708 = (code *)0x1338b7;
    pcVar6 = strstr(acStack_16f8,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00133958;
    pcStack_1708 = (code *)0x1338c8;
    bson_free(uVar5);
    pcStack_1708 = (code *)0x1338d9;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar9);
    pcStack_1708 = (code *)0x1338f6;
    cVar1 = bson_init_from_json(auStack_1500,uVar5,0xffffffffffffffff,&iStack_1700);
    if (cVar1 != '\0') goto LAB_00133949;
    if (iStack_1700 != 1) goto LAB_00133967;
    if (iStack_16fc != 2) goto LAB_00133962;
    pcStack_1708 = (code *)0x133918;
    pcVar6 = strstr(acStack_16f8,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_0013396c;
    pcStack_1708 = (code *)0x133925;
    bson_free(uVar5);
    pcVar9 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  }
  pcStack_1708 = (code *)0x133949;
  test_bson_json_double_overflow_cold_8();
LAB_00133949:
  pcStack_1708 = (code *)0x13394e;
  test_bson_json_double_overflow_cold_6();
LAB_0013394e:
  pcStack_1708 = (code *)0x133953;
  test_bson_json_double_overflow_cold_2();
LAB_00133953:
  pcStack_1708 = (code *)0x133958;
  test_bson_json_double_overflow_cold_1();
LAB_00133958:
  pcStack_1708 = (code *)0x133962;
  test_bson_json_double_overflow_cold_7();
LAB_00133962:
  pcStack_1708 = (code *)0x133967;
  test_bson_json_double_overflow_cold_4();
LAB_00133967:
  pcStack_1708 = (code *)0x13396c;
  test_bson_json_double_overflow_cold_3();
LAB_0013396c:
  pcStack_1708 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1720 = "out of range";
  pcVar16 = "{ \"d\": NaN }";
  ppuVar19 = &PTR_anon_var_dwarf_1af33_00163328;
  __haystack = aiStack_1a80;
  piVar20 = &iStack_19b8;
  piVar22 = (int *)0x14c766;
  pcVar6 = (char *)&dStack_1a88;
  uStack_1730 = uVar5;
  puStack_1728 = (undefined1 *)&iStack_1700;
  pcStack_1718 = pcVar9;
  ppuStack_1710 = ppuVar21;
  pcStack_1708 = (code *)&pcStack_1388;
  do {
    apcStack_1b08[0] = (code *)0x1339ca;
    cVar1 = bson_init_from_json(__haystack,pcVar16,0xffffffffffffffff,piVar20);
    if (cVar1 == '\0') {
      apcStack_1b08[0] = (code *)0x133b2b;
      test_bson_json_nan_cold_1();
LAB_00133b2b:
      apcStack_1b08[0] = (code *)0x133b30;
      test_bson_json_nan_cold_2();
LAB_00133b30:
      apcStack_1b08[0] = (code *)0x133b35;
      test_bson_json_nan_cold_3();
      goto LAB_00133b35;
    }
    apcStack_1b08[0] = (code *)0x1339d7;
    uVar5 = bson_bcone_magic();
    apcStack_1b08[0] = (code *)0x1339f2;
    cVar1 = bcon_extract(__haystack,"d",uVar5,1,pcVar6,0);
    if (cVar1 == '\0') goto LAB_00133b2b;
    if (!NAN(dStack_1a88) && !NAN(dStack_1a88)) goto LAB_00133b30;
    apcStack_1b08[0] = (code *)0x133a12;
    bson_destroy(__haystack);
    pcVar16 = *ppuVar19;
    ppuVar19 = ppuVar19 + 1;
  } while (pcVar16 != (char *)0x0);
  pcVar9 = "{ \"d\": NaNn }";
  ppuVar19 = &PTR_anon_var_dwarf_1af63_00163358;
  __haystack = aiStack_19b0;
  piVar20 = aiStack_1a80;
  piVar22 = &iStack_19b8;
  pcVar6 = "Got parse error at";
  do {
    apcStack_1b08[0] = (code *)0x133a5e;
    cVar1 = bson_init_from_json(piVar20,pcVar9,0xffffffffffffffff,piVar22);
    if (cVar1 != '\0') goto LAB_00133b35;
    if (iStack_19b8 != 1) goto LAB_00133b4c;
    if (iStack_19b4 != 1) goto LAB_00133b3f;
    apcStack_1b08[0] = (code *)0x133a91;
    pcVar9 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar9 == (char *)0x0) goto LAB_00133b44;
    pcVar9 = *ppuVar19;
    ppuVar19 = ppuVar19 + 1;
  } while (pcVar9 != (char *)0x0);
  pcVar9 = "{ \"d\": nu";
  ppuVar19 = &PTR_anon_var_dwarf_1afab_00163398;
  piVar20 = aiStack_1a80;
  piVar22 = &iStack_19b8;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_1b08[0] = (code *)0x133ade;
    cVar1 = bson_init_from_json(piVar20,pcVar9,0xffffffffffffffff,piVar22);
    if (cVar1 != '\0') break;
    if (iStack_19b8 != 1) goto LAB_00133b5e;
    if (iStack_19b4 != 1) goto LAB_00133b51;
    apcStack_1b08[0] = (code *)0x133b05;
    pcVar9 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar9 == (char *)0x0) goto LAB_00133b56;
    pcVar9 = *ppuVar19;
    ppuVar19 = ppuVar19 + 1;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  }
LAB_00133b3a:
  apcStack_1b08[0] = (code *)0x133b3f;
  test_bson_json_nan_cold_9();
LAB_00133b3f:
  apcStack_1b08[0] = (code *)0x133b44;
  test_bson_json_nan_cold_5();
LAB_00133b44:
  apcStack_1b08[0] = (code *)0x133b4c;
  test_bson_json_nan_cold_10();
LAB_00133b4c:
  apcStack_1b08[0] = (code *)0x133b51;
  test_bson_json_nan_cold_4();
LAB_00133b51:
  apcStack_1b08[0] = (code *)0x133b56;
  test_bson_json_nan_cold_7();
LAB_00133b56:
  apcStack_1b08[0] = (code *)0x133b5e;
  test_bson_json_nan_cold_8();
LAB_00133b5e:
  apcStack_1b08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar9 = "{ \"d\": Infinity }";
  ppuVar21 = &PTR_anon_var_dwarf_1b023_001633b8;
  piStack_1b30 = __haystack;
  pdStack_1b28 = (double *)pcVar6;
  ppuStack_1b20 = ppuVar19;
  piStack_1b18 = piVar20;
  piStack_1b10 = piVar22;
  apcStack_1b08[0] = (code *)&pcStack_1708;
  do {
    apcStack_1f08[0] = (code *)0x133bb4;
    cVar1 = bson_init_from_json(auStack_1e80,pcVar9,0xffffffffffffffff,&uStack_1db8);
    if (cVar1 == '\0') {
      apcStack_1f08[0] = (code *)0x133dd5;
      test_bson_json_infinity_cold_1();
LAB_00133dd5:
      apcStack_1f08[0] = (code *)0x133dda;
      test_bson_json_infinity_cold_2();
LAB_00133dda:
      apcStack_1f08[0] = (code *)0x133ddf;
      test_bson_json_infinity_cold_3();
      goto LAB_00133ddf;
    }
    apcStack_1f08[0] = (code *)0x133bc1;
    __haystack = (int *)bson_bcone_magic();
    apcStack_1f08[0] = (code *)0x133bdf;
    cVar1 = bcon_extract(auStack_1e80,"d",__haystack,1,&puStack_1e88,0);
    if (cVar1 == '\0') goto LAB_00133dd5;
    if ((NAN((double)puStack_1e88)) ||
       (!NAN((double)puStack_1e88 - (double)puStack_1e88) &&
        !NAN((double)puStack_1e88 - (double)puStack_1e88))) goto LAB_00133dda;
    apcStack_1f08[0] = (code *)0x133c0d;
    bson_destroy(auStack_1e80);
    pcVar9 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar9 != (char *)0x0);
  pcVar6 = "{ \"d\": -Infinity }";
  ppuVar21 = &PTR_anon_var_dwarf_1b047_001633d8;
  do {
    apcStack_1f08[0] = (code *)0x133c52;
    cVar1 = bson_init_from_json(auStack_1e80,pcVar6,0xffffffffffffffff,&uStack_1db8);
    if (cVar1 == '\0') goto LAB_00133ddf;
    apcStack_1f08[0] = (code *)0x133c75;
    cVar1 = bcon_extract(auStack_1e80,"d",__haystack,1,&puStack_1e88,0);
    if (cVar1 == '\0') goto LAB_00133de4;
    if ((NAN((double)puStack_1e88)) || (!NAN((double)puStack_1e88 - (double)puStack_1e88)))
    goto LAB_00133de9;
    if (0.0 <= (double)puStack_1e88) goto LAB_00133dee;
    apcStack_1f08[0] = (code *)0x133cb5;
    bson_destroy(auStack_1e80);
    pcVar6 = *ppuVar21;
    ppuVar21 = ppuVar21 + 1;
  } while (pcVar6 != (char *)0x0);
  pcVar9 = "{ \"d\": Infinityy }";
  ppuVar19 = &PTR_anon_var_dwarf_1b06b_001633f8;
  __haystack = aiStack_1db0;
  ppuVar21 = (undefined **)&uStack_1db8;
  pcVar6 = "Got parse error at";
  do {
    apcStack_1f08[0] = (code *)0x133d04;
    cVar1 = bson_init_from_json(auStack_1e80,pcVar9,0xffffffffffffffff,ppuVar21);
    if (cVar1 != '\0') goto LAB_00133df3;
    if ((int)uStack_1db8 != 1) goto LAB_00133e0a;
    if (uStack_1db8._4_4_ != 1) goto LAB_00133dfd;
    apcStack_1f08[0] = (code *)0x133d37;
    pcVar9 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar9 == (char *)0x0) goto LAB_00133e02;
    pcVar9 = *ppuVar19;
    ppuVar19 = ppuVar19 + 1;
  } while (pcVar9 != (char *)0x0);
  pcVar9 = "{ \"d\": In";
  ppuVar19 = &PTR_anon_var_dwarf_1b0cb_00163448;
  ppuVar21 = (undefined **)&uStack_1db8;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_1f08[0] = (code *)0x133d84;
    cVar1 = bson_init_from_json(auStack_1e80,pcVar9,0xffffffffffffffff,ppuVar21);
    if (cVar1 != '\0') break;
    if ((int)uStack_1db8 != 1) goto LAB_00133e1c;
    if (uStack_1db8._4_4_ != 1) goto LAB_00133e0f;
    apcStack_1f08[0] = (code *)0x133daf;
    pcVar9 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar9 == (char *)0x0) goto LAB_00133e14;
    pcVar9 = *ppuVar19;
    ppuVar19 = ppuVar19 + 1;
    if (pcVar9 == (char *)0x0) {
      return;
    }
  }
LAB_00133df8:
  apcStack_1f08[0] = (code *)0x133dfd;
  test_bson_json_infinity_cold_13();
LAB_00133dfd:
  apcStack_1f08[0] = (code *)0x133e02;
  test_bson_json_infinity_cold_9();
LAB_00133e02:
  apcStack_1f08[0] = (code *)0x133e0a;
  test_bson_json_infinity_cold_14();
LAB_00133e0a:
  apcStack_1f08[0] = (code *)0x133e0f;
  test_bson_json_infinity_cold_8();
LAB_00133e0f:
  apcStack_1f08[0] = (code *)0x133e14;
  test_bson_json_infinity_cold_11();
LAB_00133e14:
  apcStack_1f08[0] = (code *)0x133e1c;
  test_bson_json_infinity_cold_12();
LAB_00133e1c:
  __buf = auStack_1e80;
  apcStack_1f08[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2288 = (code *)0x133e4e;
  apcStack_1f08[0] = (code *)apcStack_1b08;
  cVar1 = bson_init_from_json(auStack_2280,"{ \"x\": null }",0xffffffffffffffff,auStack_2190);
  if (cVar1 == '\0') {
    pcStack_2288 = (code *)0x133e89;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2288 = (code *)0x133e57;
    uVar5 = bson_bcone_magic();
    pcStack_2288 = (code *)0x133e73;
    cVar1 = bcon_extract(auStack_2280,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2288 = (code *)0x133e7f;
      bson_destroy(auStack_2280);
      return;
    }
  }
  pcStack_2288 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2688 = (code *)0x0;
  pcStack_2690 = "}";
  acStack_26a0[8] = -0x2e;
  acStack_26a0[9] = '>';
  acStack_26a0[10] = '\x13';
  acStack_26a0[0xb] = '\0';
  acStack_26a0[0xc] = '\0';
  acStack_26a0[0xd] = '\0';
  acStack_26a0[0xe] = '\0';
  acStack_26a0[0xf] = '\0';
  piStack_22b0 = __haystack;
  pcStack_22a8 = pcVar6;
  ppuStack_22a0 = ppuVar19;
  puStack_2298 = __buf;
  ppuStack_2290 = ppuVar21;
  pcStack_2288 = (code *)apcStack_1f08;
  uVar15 = bcon_new(0,"a","{","b","{");
  uStack_2590 = 0;
  uStack_2588 = 0;
  uStack_25a0 = 0;
  uStack_2598 = 0;
  uStack_25b0 = 0;
  uStack_25a8 = 0;
  uStack_25c0 = 0;
  uStack_25b8 = 0;
  uStack_25d0 = 0;
  uStack_25c8 = 0;
  uStack_25e0 = 0;
  uStack_25d8 = 0;
  uStack_25f0 = 0;
  uStack_25e8 = 0;
  uStack_2600 = (undefined *)0x500000003;
  uStack_25f8 = 5;
  pcStack_2688 = (code *)0x133f2f;
  cVar1 = bson_init_from_json(&uStack_2600,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2538);
  if (cVar1 != '\0') {
    pcStack_2688 = (code *)0x133f47;
    ppuVar21 = (undefined **)bson_get_data(&uStack_2600);
    pcStack_2688 = (code *)0x133f52;
    __buf = (undefined1 *)bson_get_data(uVar15);
    if (*(int *)(uVar15 + 4) == uStack_2600._4_4_) {
      pcStack_2688 = (code *)0x133f67;
      pvVar7 = (void *)bson_get_data(uVar15);
      pcStack_2688 = (code *)0x133f77;
      pvVar8 = (void *)bson_get_data(&uStack_2600);
      pcStack_2688 = (code *)0x133f85;
      iVar2 = bcmp(pvVar7,pvVar8,(ulong)*(uint *)(uVar15 + 4));
      if (iVar2 == 0) {
        pcStack_2688 = (code *)0x133f96;
        bson_destroy(&uStack_2600);
        pcStack_2688 = (code *)0x133f9e;
        bson_destroy(uVar15);
        return;
      }
    }
    ppuVar19 = (undefined **)&uStack_2600;
    pcStack_2688 = (code *)0x133fbf;
    pcVar6 = (char *)bson_as_canonical_extended_json(ppuVar19);
    pcStack_2688 = (code *)0x133fcc;
    uVar5 = bson_as_canonical_extended_json(uVar15);
    uVar3 = *(uint *)(uVar15 + 4);
    if (uStack_2600._4_4_ != 0) {
      uVar17 = 0;
      do {
        if (uVar3 == (uint)uVar17) break;
        if (*(char *)((long)ppuVar21 + uVar17) != __buf[uVar17]) goto LAB_0013409c;
        uVar17 = uVar17 + 1;
      } while (uStack_2600._4_4_ != (uint)uVar17);
    }
    uVar4 = uStack_2600._4_4_;
    if (uStack_2600._4_4_ < uVar3) {
      uVar4 = uVar3;
    }
    uVar17 = (ulong)(uVar4 - 1);
    while( true ) {
      pcStack_2688 = (code *)0x134018;
      fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,pcVar6,uVar5);
      pcStack_2688 = (code *)0x134030;
      uVar3 = open("failure.bad.bson",0x42,0x1a0);
      pcVar6 = (char *)(ulong)uVar3;
      pcStack_2688 = (code *)0x13404b;
      uVar4 = open("failure.expected.bson",0x42,0x1a0);
      uStack_2604 = uVar3;
      if (uVar3 == 0xffffffff) break;
      ppuVar19 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_001340a8;
      pcVar6 = (char *)((ulong)uStack_2600 >> 0x20);
      pcStack_2688 = (code *)0x134075;
      pcVar9 = (char *)write(uVar3,ppuVar21,(size_t)pcVar6);
      if (pcVar9 != pcVar6) goto LAB_001340ad;
      uVar15 = (ulong)*(uint *)(uVar15 + 4);
      pcStack_2688 = (code *)0x13408b;
      uVar17 = write(uVar4,__buf,uVar15);
      if (uVar17 != uVar15) goto LAB_001340b2;
      uVar17 = (ulong)uVar4;
      pcStack_2688 = (code *)0x13409c;
      test_bson_json_empty_final_object_cold_4();
      uVar5 = extraout_RAX_00;
LAB_0013409c:
      uVar17 = uVar17 & 0xffffffff;
    }
    pcStack_2688 = (code *)0x1340a8;
    test_bson_json_empty_final_object_cold_6();
LAB_001340a8:
    pcStack_2688 = (code *)0x1340ad;
    test_bson_json_empty_final_object_cold_5();
LAB_001340ad:
    pcStack_2688 = (code *)0x1340b2;
    test_bson_json_empty_final_object_cold_2();
LAB_001340b2:
    pcStack_2688 = (code *)0x1340b7;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2688 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar9 = acStack_26a0;
  acStack_26a0[8] = '\0';
  acStack_26a0[9] = '\0';
  acStack_26a0[10] = '\0';
  acStack_26a0[0xb] = '\0';
  acStack_26a0[0xc] = '\0';
  acStack_26a0[0xd] = '\0';
  acStack_26a0[0xe] = '@';
  acStack_26a0[0xf] = '0';
  acStack_26a0[0] = '\v';
  acStack_26a0[1] = '\0';
  acStack_26a0[2] = '\0';
  acStack_26a0[3] = '\0';
  acStack_26a0[4] = '\0';
  acStack_26a0[5] = '\0';
  acStack_26a0[6] = '\0';
  acStack_26a0[7] = '\0';
  pcStack_26b0 = (code *)0x1340ea;
  pcStack_2690 = (char *)uVar15;
  pcStack_2688 = (code *)__buf;
  plVar11 = (long *)bson_new();
  pcStack_26b0 = (code *)0x134104;
  cVar1 = bson_append_decimal128(plVar11,"decimal128",0xffffffff,pcVar9);
  if (cVar1 == '\0') {
    pcStack_26b0 = (code *)0x134152;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_26b0 = (code *)0x134113;
    pcVar9 = (char *)bson_as_json(plVar11,auStack_26a8);
    if (pcVar9 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00134135:
      pcStack_26b0 = (code *)0x13413d;
      bson_free(pcVar9);
      pcStack_26b0 = (code *)0x134145;
      bson_destroy(plVar11);
      return;
    }
    pcStack_26b0 = (code *)0x134131;
    iVar2 = strcmp(pcVar9,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00134135;
  }
  pcStack_26b0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar24 = &pcStack_26b0;
  ppuStack_2b08 = (undefined **)0x13418d;
  plStack_26b8 = plVar11;
  pcStack_26b0 = (code *)&pcStack_2288;
  cVar1 = bson_init_from_json(auStack_2a00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_2918);
  if (cVar1 == '\0') goto LAB_00134231;
  ppuStack_2b08 = (undefined **)0x1341aa;
  cVar1 = bson_iter_init(auStack_2a80,auStack_2a00);
  if (cVar1 == '\0') {
    ppuStack_2b08 = (undefined **)0x13421d;
    test_bson_json_number_decimal_cold_2();
LAB_0013421d:
    ppuStack_2b08 = (undefined **)0x134222;
    test_bson_json_number_decimal_cold_3();
LAB_00134222:
    ppuStack_2b08 = (undefined **)0x134227;
    test_bson_json_number_decimal_cold_4();
LAB_00134227:
    ppuStack_2b08 = (undefined **)0x13422c;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    ppuStack_2b08 = (undefined **)0x1341c2;
    cVar1 = bson_iter_find(auStack_2a80,"key");
    if (cVar1 == '\0') goto LAB_0013421d;
    ppuStack_2b08 = (undefined **)0x1341d3;
    iVar2 = bson_iter_type(auStack_2a80);
    if (iVar2 != 0x13) goto LAB_00134222;
    plVar11 = &lStack_2a90;
    ppuStack_2b08 = (undefined **)0x1341ed;
    bson_iter_decimal128(auStack_2a80,plVar11);
    if (lStack_2a90 != 0xb) goto LAB_00134227;
    if (lStack_2a88 == 0x3040000000000000) {
      ppuStack_2b08 = (undefined **)0x134211;
      bson_destroy(auStack_2a00);
      return;
    }
  }
  ppuStack_2b08 = (undefined **)0x134231;
  test_bson_json_number_decimal_cold_6();
LAB_00134231:
  ppuStack_2b08 = (undefined **)test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar16 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar18 = &PTR_anon_var_dwarf_1b1c7_00163470;
  plStack_2b20 = plVar11;
  pcStack_2b18 = pcVar6;
  pcStack_2b10 = pcVar9;
  ppuStack_2b08 = ppuVar21;
  do {
    pcStack_2d30 = (code *)0x134273;
    lVar10 = bson_new_from_json(pcVar16,0xffffffffffffffff,&iStack_2d20);
    if (lVar10 != 0) {
      pcStack_2d30 = (code *)0x1342c0;
      test_bson_json_errors_cold_1();
LAB_001342c0:
      pcStack_2d30 = (code *)0x1342de;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_2d18,
              ppuVar21);
      pcStack_2d30 = (code *)0x1342e3;
      abort();
    }
    if (iStack_2d20 != 1) {
LAB_001342e8:
      pcStack_2d30 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_2f48 = (code *)0x13430d;
      pcStack_2d38 = acStack_2d18;
      pcStack_2d30 = (code *)&iStack_2d20;
      pcVar6 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_2f38);
      pcStack_2f48 = (code *)0x13431a;
      pcVar9 = (char *)bson_as_json(pcVar6,0);
      if (pcVar9 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_0013433c:
        pcStack_2f48 = (code *)0x134344;
        bson_free(pcVar9);
        pcStack_2f48 = (code *)0x13434c;
        bson_destroy(pcVar6);
        return;
      }
      pcStack_2f48 = (code *)0x134338;
      iVar2 = strcmp(pcVar9,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_0013433c;
      pcStack_2f48 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3158 = 0x2200223a2261227b;
      uStack_3150 = 0x7d;
      uStack_315c = 0x227b;
      pcStack_2f48 = (code *)pcVar6;
      lVar10 = bson_new_from_json(&uStack_3158,9,&iStack_3148);
      if (lVar10 == 0) {
        if (iStack_3148 != 1) goto LAB_00134418;
        if (iStack_3144 != 1) goto LAB_0013441d;
        pcVar6 = acStack_3140;
        pcVar16 = strstr(pcVar6,"Got parse error");
        if (pcVar16 == (char *)0x0) goto LAB_00134422;
        lVar10 = bson_new_from_json(&uStack_315c,3,&iStack_3148);
        if (lVar10 != 0) goto LAB_00134413;
        if (iStack_3148 != 1) goto LAB_0013442a;
        if (iStack_3144 == 1) {
          pcVar16 = strstr(pcVar6,"Got parse error");
          if (pcVar16 != (char *)0x0) {
            return;
          }
          goto LAB_00134434;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_00134413:
        test_bson_json_null_in_str_cold_4();
LAB_00134418:
        test_bson_json_null_in_str_cold_2();
LAB_0013441d:
        test_bson_json_null_in_str_cold_3();
LAB_00134422:
        test_bson_json_null_in_str_cold_8();
LAB_0013442a:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00134434:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX_01;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar12 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar12,0xf,1,0,uVar5,pcVar6,ppuVar18,ppuVar19,pcVar9,ppuVar21,ppcVar24)
      ;
      uVar13 = bcon_new(0,"b",uVar12,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar13,0);
      uVar5 = bson_new();
      uVar13 = bson_new();
      uVar14 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar13,uVar14,0);
      uVar5 = bcon_new(0,"a",uVar12,0xf,1,"b",uVar12,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar12,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar12,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar12,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar12,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_2d1c != 2) {
      pcStack_2d30 = (code *)0x1342e8;
      test_bson_json_errors_cold_3();
      goto LAB_001342e8;
    }
    ppuVar21 = (undefined **)ppuVar18[-1];
    pcStack_2d30 = (code *)0x13429a;
    pcVar6 = strstr(acStack_2d18,(char *)ppuVar21);
    if (pcVar6 == (char *)0x0) goto LAB_001342c0;
    pcVar16 = *ppuVar18;
    ppuVar18 = ppuVar18 + 2;
    if (pcVar16 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00133b35:
  apcStack_1b08[0] = (code *)0x133b3a;
  test_bson_json_nan_cold_11();
  goto LAB_00133b3a;
LAB_00133ddf:
  apcStack_1f08[0] = (code *)0x133de4;
  test_bson_json_infinity_cold_4();
LAB_00133de4:
  apcStack_1f08[0] = (code *)0x133de9;
  test_bson_json_infinity_cold_5();
LAB_00133de9:
  apcStack_1f08[0] = (code *)0x133dee;
  test_bson_json_infinity_cold_6();
LAB_00133dee:
  ppuVar19 = &puStack_1e88;
  pcVar6 = "d";
  apcStack_1f08[0] = (code *)0x133df3;
  test_bson_json_infinity_cold_7();
LAB_00133df3:
  apcStack_1f08[0] = (code *)0x133df8;
  test_bson_json_infinity_cold_15();
  goto LAB_00133df8;
}

Assistant:

static void
test_bson_json_uescape_key (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   bson_t *bson_euro = BCON_NEW ("\xE2\x82\xAC", BCON_UTF8 ("euro"));

   r = bson_init_from_json (&b, "{ \"\\u20AC\": \"euro\"}", -1, &error);
   BSON_ASSERT (r);
   bson_eq_bson (&b, bson_euro);

   bson_destroy (&b);
   bson_destroy (bson_euro);
}